

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O2

ModulePtr __thiscall
chaiscript::bootstrap::standard_library::
vector_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
          (standard_library *this,string *type,ModulePtr *m)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  ModulePtr MVar5;
  allocator local_1a9;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_1a8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_198;
  value_type local_188;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_158;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_148;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_128;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2> local_108;
  standard_library local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  standard_library local_e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  standard_library local_d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  standard_library local_c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  standard_library local_b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  standard_library local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  standard_library local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string((string *)&local_48,(string *)type);
  local_188._M_dataplus._M_p =
       (pointer)&std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
                 typeinfo;
  local_188._M_string_length =
       (size_type)
       &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::typeinfo;
  local_188.field_2._M_allocated_capacity._0_4_ = 0;
  std::
  vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
  ::emplace_back<chaiscript::Type_Info,std::__cxx11::string>
            ((vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>
              *)peVar1,(Type_Info *)&local_188,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  fun<chaiscript::Boxed_Value&,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            ((offset_in_vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_to_subr
              )&local_198);
  std::__cxx11::string::string((string *)&local_68,"front",(allocator *)&local_188);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_198,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_198.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  fun<chaiscript::Boxed_Value_const&,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            ((offset_in_vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_to_subr
              )&local_1a8);
  std::__cxx11::string::string((string *)&local_88,"front",(allocator *)&local_188);
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&peVar1->m_funcs,&local_1a8,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_1a8.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_108,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  back_insertion_sequence_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            (local_98,type,(ModulePtr *)&local_108);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_118,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  sequence_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            (local_a8,type,(ModulePtr *)&local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_128,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  random_access_container_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            (local_b8,type,(ModulePtr *)&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_138,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  container_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            (local_c8,type,(ModulePtr *)&local_138);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_148,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  default_constructible_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            (local_d8,type,(ModulePtr *)&local_148);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_158,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  assignable_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            (local_e8,type,(ModulePtr *)&local_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
  std::__shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_168,&m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>);
  input_range_type<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>>
            (local_f8,type,(ModulePtr *)&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
  bVar3 = std::type_info::operator==
                    ((type_info *)
                     &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
                      typeinfo,
                     (type_info *)
                     &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::
                      typeinfo);
  _Var4._M_pi = extraout_RDX;
  if (bVar3) {
    peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::string
              ((string *)&local_188,
               "\n                    def Vector::`==`(Vector rhs) {\n                       if ( rhs.size() != this.size() ) {\n                         return false;\n                       } else {\n                         auto r1 = range(this);\n                         auto r2 = range(rhs);\n                         while (!r1.empty())\n                         {\n                           if (!eq(r1.front(), r2.front()))\n                           {\n                             return false;\n                           }\n                           r1.pop_front();\n                           r2.pop_front();\n                         }\n                         true;\n                       }\n                   } "
               ,&local_1a9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&peVar1->m_evals,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    _Var4._M_pi = extraout_RDX_00;
  }
  peVar1 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(element_type **)this = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
  (m->super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  MVar5.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  MVar5.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModulePtr)MVar5.super___shared_ptr<chaiscript::Module,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModulePtr vector_type(const std::string &type, ModulePtr m = std::make_shared<Module>())
        {
          m->add(user_type<VectorType>(), type);

          typedef typename VectorType::reference (VectorType::*frontptr)();
          typedef typename VectorType::const_reference (VectorType::*constfrontptr)() const;

          m->add(fun(static_cast<frontptr>(&VectorType::front)), "front");
          m->add(fun(static_cast<constfrontptr>(&VectorType::front)), "front");


          back_insertion_sequence_type<VectorType>(type, m);
          sequence_type<VectorType>(type, m);
          random_access_container_type<VectorType>(type, m);
          container_type<VectorType>(type, m);
          default_constructible_type<VectorType>(type, m);
          assignable_type<VectorType>(type, m);
          input_range_type<VectorType>(type, m);

          if (typeid(VectorType) == typeid(std::vector<Boxed_Value>))
          {
            m->eval(R"(
                    def Vector::`==`(Vector rhs) {
                       if ( rhs.size() != this.size() ) {
                         return false;
                       } else {
                         auto r1 = range(this);
                         auto r2 = range(rhs);
                         while (!r1.empty())
                         {
                           if (!eq(r1.front(), r2.front()))
                           {
                             return false;
                           }
                           r1.pop_front();
                           r2.pop_front();
                         }
                         true;
                       }
                   } )"
                 );
          } 

          return m;
        }